

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::moveAppend
          (QGenericArrayOps<QKmsPlane> *this,QKmsPlane *b,QKmsPlane *e)

{
  qsizetype *pqVar1;
  QKmsPlane *pQVar2;
  long lVar3;
  Data *pDVar4;
  uint *puVar5;
  qsizetype qVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  QKmsPlane *pQVar11;
  Type TVar12;
  Rotations RVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QKmsPlane>).size;
      pQVar2[lVar3].possibleCrtcs = b->possibleCrtcs;
      TVar12 = b->type;
      pQVar2[lVar3].id = b->id;
      pQVar2[lVar3].type = TVar12;
      pDVar4 = (b->supportedFormats).d.d;
      (b->supportedFormats).d.d = (Data *)0x0;
      pQVar2[lVar3].supportedFormats.d.d = pDVar4;
      puVar5 = (b->supportedFormats).d.ptr;
      (b->supportedFormats).d.ptr = (uint *)0x0;
      pQVar2[lVar3].supportedFormats.d.ptr = puVar5;
      qVar6 = (b->supportedFormats).d.size;
      (b->supportedFormats).d.size = 0;
      pQVar2[lVar3].supportedFormats.d.size = qVar6;
      RVar13.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (b->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar7 = *(undefined8 *)&b->rotationPropertyId;
      uVar14 = b->framebufferPropertyId;
      uVar15 = b->srcXPropertyId;
      uVar8 = *(undefined8 *)&b->srcYPropertyId;
      uVar16 = b->crtcYPropertyId;
      uVar17 = b->srcwidthPropertyId;
      uVar9 = *(undefined8 *)&b->srcheightPropertyId;
      uVar18 = b->crtcheightPropertyId;
      uVar19 = b->zposPropertyId;
      uVar10 = *(undefined8 *)&b->blendOpPropertyId;
      pQVar11 = pQVar2 + lVar3;
      pQVar11->initialRotation =
           (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
           (b->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      pQVar11->availableRotations =
           (Rotations)
           RVar13.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      *(undefined8 *)(&pQVar11->initialRotation + 2) = uVar7;
      pQVar11 = pQVar2 + lVar3;
      pQVar11->framebufferPropertyId = uVar14;
      pQVar11->srcXPropertyId = uVar15;
      *(undefined8 *)(&pQVar11->framebufferPropertyId + 2) = uVar8;
      pQVar11 = pQVar2 + lVar3;
      pQVar11->crtcYPropertyId = uVar16;
      pQVar11->srcwidthPropertyId = uVar17;
      *(undefined8 *)(&pQVar11->crtcYPropertyId + 2) = uVar9;
      pQVar11 = pQVar2 + lVar3;
      pQVar11->crtcheightPropertyId = uVar18;
      pQVar11->zposPropertyId = uVar19;
      *(undefined8 *)(&pQVar11->crtcheightPropertyId + 2) = uVar10;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QKmsPlane>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }